

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::SendRTPData(RTPUDPv6Transmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  int iVar3;
  
  if (this->init == true) {
    if (this->created == true) {
      if (this->maxpacksize < len) {
        iVar3 = -0x75;
      }
      else {
        pHVar2 = (this->destinations).firsthashelem;
        (this->destinations).curhashelem = pHVar2;
        iVar3 = 0;
        while (pHVar2 != (HashElement *)0x0) {
          sendto(this->rtpsock,data,len,0,(sockaddr *)&pHVar2->element,0x1c);
          pHVar1 = (this->destinations).curhashelem;
          pHVar2 = (HashElement *)0x0;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar2 = pHVar1->listnext;
            (this->destinations).curhashelem = pHVar2;
          }
        }
      }
    }
    else {
      iVar3 = -0x71;
    }
  }
  else {
    iVar3 = -0x72;
  }
  return iVar3;
}

Assistant:

int RTPUDPv6Transmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTPSockAddr(),sizeof(struct sockaddr_in6));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}